

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_striped_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_trace_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  __m256i alVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m256i *palVar18;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *palVar19;
  __m256i *ptr_02;
  int32_t *ptr_03;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  __m256i *palVar24;
  char *pcVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  char *__format;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  __m256i *ptr_04;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  __m256i_32_t e;
  __m256i_32_t h;
  int local_1ac;
  int local_180;
  long local_170;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar49 [64];
  
  auVar55 = in_ZMM10._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "profile";
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "profile->profile32.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar25 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar25 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "open";
        }
        else {
          if (-1 < gap) {
            uVar15 = uVar4 - 1;
            uVar38 = (ulong)uVar4 + 7 >> 3;
            uVar9 = (ulong)uVar15 % uVar38;
            uVar29 = -open;
            uVar30 = ppVar7->min;
            uVar22 = 0x80000000 - uVar30;
            if (uVar30 != uVar29 && SBORROW4(uVar30,uVar29) == (int)(uVar30 + open) < 0) {
              uVar22 = open | 0x80000000;
            }
            iVar16 = 0x7ffffffe - ppVar7->max;
            uVar30 = (uint)uVar38;
            ppVar17 = parasail_result_new_trace(uVar30,s2Len,0x20,0x20);
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x8480802;
              palVar18 = parasail_memalign___m256i(0x20,uVar38);
              ptr = parasail_memalign___m256i(0x20,uVar38);
              ptr_00 = parasail_memalign___m256i(0x20,uVar38);
              ptr_01 = parasail_memalign___m256i(0x20,uVar38);
              palVar19 = parasail_memalign___m256i(0x20,uVar38);
              ptr_02 = parasail_memalign___m256i(0x20,uVar38);
              ptr_03 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
              uVar20 = 0;
              if ((ptr_03 != (int32_t *)0x0 &&
                  (ptr_02 != (__m256i *)0x0 && palVar19 != (__m256i *)0x0)) &&
                  ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar18 != (__m256i *)0x0))) {
                iVar21 = s2Len + -1;
                iVar27 = 7 - (int)(uVar15 / uVar38);
                auVar50._4_4_ = open;
                auVar50._0_4_ = open;
                auVar50._8_4_ = open;
                auVar50._12_4_ = open;
                auVar50._16_4_ = open;
                auVar50._20_4_ = open;
                auVar50._24_4_ = open;
                auVar50._28_4_ = open;
                auVar51._4_4_ = gap;
                auVar51._0_4_ = gap;
                auVar51._8_4_ = gap;
                auVar51._12_4_ = gap;
                auVar51._16_4_ = gap;
                auVar51._20_4_ = gap;
                auVar51._24_4_ = gap;
                auVar51._28_4_ = gap;
                uVar22 = uVar22 + 1;
                auVar48._4_4_ = iVar16;
                auVar48._0_4_ = iVar16;
                auVar48._8_4_ = iVar16;
                auVar48._12_4_ = iVar16;
                auVar48._16_4_ = iVar16;
                auVar48._20_4_ = iVar16;
                auVar48._24_4_ = iVar16;
                auVar48._28_4_ = iVar16;
                auVar49 = ZEXT3264(auVar48);
                auVar46._4_4_ = iVar27;
                auVar46._0_4_ = iVar27;
                auVar46._8_4_ = iVar27;
                auVar46._12_4_ = iVar27;
                auVar46._16_4_ = iVar27;
                auVar46._20_4_ = iVar27;
                auVar46._24_4_ = iVar27;
                auVar46._28_4_ = iVar27;
                uVar31 = uVar29;
                for (; uVar20 != uVar38; uVar20 = uVar20 + 1) {
                  uVar32 = uVar31;
                  for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
                    uVar35 = 0;
                    if (s1_beg == 0) {
                      uVar35 = uVar32;
                    }
                    *(uint *)((long)&local_80 + lVar33 * 4) = uVar35;
                    lVar36 = (long)(int)uVar35 - (ulong)(uint)open;
                    if (lVar36 < -0x7fffffff) {
                      lVar36 = -0x80000000;
                    }
                    *(int *)((long)&local_a0 + lVar33 * 4) = (int)lVar36;
                    uVar32 = uVar32 - gap * uVar30;
                  }
                  palVar24 = palVar18 + uVar20;
                  (*palVar24)[0] = local_80;
                  (*palVar24)[1] = lStack_78;
                  (*palVar24)[2] = lStack_70;
                  (*palVar24)[3] = lStack_68;
                  palVar24 = ptr_00 + uVar20;
                  (*palVar24)[0] = local_a0;
                  (*palVar24)[1] = lStack_98;
                  (*palVar24)[2] = lStack_90;
                  (*palVar24)[3] = lStack_88;
                  palVar24 = ptr_01 + uVar20;
                  (*palVar24)[0] = local_a0;
                  (*palVar24)[1] = lStack_98;
                  (*palVar24)[2] = lStack_90;
                  (*palVar24)[3] = lStack_88;
                  uVar31 = uVar31 - gap;
                }
                *ptr_03 = 0;
                uVar31 = uVar29;
                for (uVar20 = 1; s2Len + 1 != uVar20; uVar20 = uVar20 + 1) {
                  uVar32 = 0;
                  if (s2_beg == 0) {
                    uVar32 = uVar31;
                  }
                  ptr_03[uVar20] = uVar32;
                  uVar31 = uVar31 - gap;
                }
                lVar36 = uVar38 * 0x20;
                for (lVar33 = 0; lVar36 != lVar33; lVar33 = lVar33 + 0x20) {
                  puVar1 = (undefined8 *)((long)((ppVar17->field_4).rowcols)->score_row + lVar33);
                  *puVar1 = 0x800000008;
                  puVar1[1] = 0x800000008;
                  puVar1[2] = 0x800000008;
                  puVar1[3] = 0x800000008;
                }
                lVar33 = 0;
                auVar13 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                auVar46 = vpcmpeqd_avx2(auVar46,_DAT_008a58a0);
                auVar10 = vpcmpeqd_avx2(auVar55,auVar55);
                auVar55._4_4_ = uVar22;
                auVar55._0_4_ = uVar22;
                auVar55._8_4_ = uVar22;
                auVar55._12_4_ = uVar22;
                auVar55._16_4_ = uVar22;
                auVar55._20_4_ = uVar22;
                auVar55._24_4_ = uVar22;
                auVar55._28_4_ = uVar22;
                auVar47 = ZEXT3264(auVar55);
                uVar20 = 0;
                local_1ac = iVar21;
                local_170 = lVar36;
                do {
                  ptr_04 = palVar18;
                  palVar24 = palVar19;
                  if (uVar20 == (uint)s2Len) {
                    uVar29 = uVar22;
                    if (s2_end != 0) {
                      for (iVar16 = 0; iVar16 < iVar27; iVar16 = iVar16 + 1) {
                        auVar46 = vperm2i128_avx2(auVar55,auVar55,0x28);
                        auVar55 = vpalignr_avx2(auVar55,auVar46,0xc);
                      }
                      uVar29 = auVar55._28_4_;
                    }
                    uVar31 = uVar15;
                    if (s1_end != 0) {
                      for (uVar38 = 0; (uVar30 & 0xfffffff) << 3 != (uint)uVar38;
                          uVar38 = uVar38 + 1) {
                        uVar32 = ((uint)uVar38 & 7) * uVar30 + ((uint)(uVar38 >> 3) & 0x1fffffff);
                        uVar35 = uVar29;
                        iVar16 = local_1ac;
                        uVar14 = uVar31;
                        if (((int)uVar32 < (int)uVar4) &&
                           (uVar5 = *(uint *)((long)*ptr_04 + uVar38 * 4), uVar35 = uVar5,
                           iVar16 = iVar21, uVar14 = uVar32, (int)uVar5 <= (int)uVar29)) {
                          if ((int)uVar31 <= (int)uVar32) {
                            uVar32 = uVar31;
                          }
                          uVar35 = uVar29;
                          iVar16 = local_1ac;
                          uVar14 = uVar31;
                          if (local_1ac == iVar21 && uVar5 == uVar29) {
                            uVar14 = uVar32;
                          }
                        }
                        uVar31 = uVar14;
                        local_1ac = iVar16;
                        uVar29 = uVar35;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar3 = ptr_04[uVar9];
                      for (iVar16 = 0; iVar16 < iVar27; iVar16 = iVar16 + 1) {
                        auVar55 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,
                                                  0x28);
                        alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar55,0xc);
                      }
                      uVar29 = alVar3[3]._4_4_;
                      local_1ac = iVar21;
                      uVar31 = uVar15;
                    }
                    auVar10._4_4_ = uVar22;
                    auVar10._0_4_ = uVar22;
                    auVar10._8_4_ = uVar22;
                    auVar10._12_4_ = uVar22;
                    auVar10._16_4_ = uVar22;
                    auVar10._20_4_ = uVar22;
                    auVar10._24_4_ = uVar22;
                    auVar10._28_4_ = uVar22;
                    auVar55 = vpcmpgtd_avx2(auVar10,auVar49._0_32_);
                    auVar46 = vpcmpgtd_avx2(auVar47._0_32_,auVar48);
                    auVar55 = vpor_avx2(auVar55,auVar46);
                    if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar55 >> 0x7f,0) != '\0') ||
                          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar55 >> 0xbf,0) != '\0') ||
                        (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar55[0x1f] < '\0') {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      uVar29 = 0;
                      local_1ac = 0;
                      uVar31 = 0;
                    }
                    ppVar17->score = uVar29;
                    ppVar17->end_query = uVar31;
                    ppVar17->end_ref = local_1ac;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(palVar24);
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_04);
                    return ppVar17;
                  }
                  auVar44 = vpermd_avx2(auVar13,(undefined1  [32])ptr_04[uVar30 - 1]);
                  auVar44 = vpblendd_avx2(auVar44,ZEXT432((uint)ptr_03[uVar20]),1);
                  iVar16 = ppVar7->mapper[(byte)s2[uVar20]] * uVar30;
                  uVar34 = 1;
                  auVar12._4_4_ = uVar22;
                  auVar12._0_4_ = uVar22;
                  auVar12._8_4_ = uVar22;
                  auVar12._12_4_ = uVar22;
                  auVar12._16_4_ = uVar22;
                  auVar12._20_4_ = uVar22;
                  auVar12._24_4_ = uVar22;
                  auVar12._28_4_ = uVar22;
                  for (lVar28 = 0; iVar26 = (int)(uVar20 + 1), lVar36 != lVar28;
                      lVar28 = lVar28 + 0x20) {
                    auVar2 = *(undefined1 (*) [32])((long)*ptr_00 + lVar28);
                    auVar44 = vpaddd_avx2(auVar44,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar28 + (long)iVar16 * 0x20));
                    auVar56 = vpmaxsd_avx2(auVar44,auVar2);
                    auVar11 = vpmaxsd_avx2(auVar56,auVar12);
                    *(undefined1 (*) [32])((long)*ptr + lVar28) = auVar11;
                    auVar42 = vpcmpeqd_avx2(auVar11,auVar44);
                    auVar44 = vpcmpgtd_avx2(auVar56,auVar12);
                    auVar56._8_4_ = 2;
                    auVar56._0_8_ = 0x200000002;
                    auVar56._12_4_ = 2;
                    auVar56._16_4_ = 2;
                    auVar56._20_4_ = 2;
                    auVar56._24_4_ = 2;
                    auVar56._28_4_ = 2;
                    auVar44 = vpaddd_avx2(auVar44,auVar56);
                    auVar57._8_4_ = 4;
                    auVar57._0_8_ = 0x400000004;
                    auVar57._12_4_ = 4;
                    auVar57._16_4_ = 4;
                    auVar57._20_4_ = 4;
                    auVar57._24_4_ = 4;
                    auVar57._28_4_ = 4;
                    auVar44 = vblendvps_avx(auVar44,auVar57,auVar42);
                    auVar42 = vorps_avx(auVar44,*(undefined1 (*) [32])
                                                 ((long)((ppVar17->field_4).rowcols)->score_row +
                                                 lVar28 + lVar33));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar28) = auVar44;
                    *(undefined1 (*) [32])
                     ((long)((ppVar17->field_4).rowcols)->score_row + lVar28 + lVar33) = auVar42;
                    auVar42 = vpsubd_avx2(auVar11,auVar50);
                    in_ZMM11 = ZEXT3264(auVar42);
                    auVar44 = vpsubd_avx2(auVar2,auVar51);
                    auVar44 = vpmaxsd_avx2(auVar42,auVar44);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar28) = auVar44;
                    auVar56 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar28),auVar51);
                    auVar44 = vpmaxsd_avx2(auVar42,auVar56);
                    *(undefined1 (*) [32])((long)*palVar24 + lVar28) = auVar44;
                    if (iVar26 < s2Len) {
                      auVar44 = vpcmpgtd_avx2(auVar42,auVar56);
                      auVar58._8_4_ = 8;
                      auVar58._0_8_ = 0x800000008;
                      auVar58._12_4_ = 8;
                      auVar58._16_4_ = 8;
                      auVar58._20_4_ = 8;
                      auVar58._24_4_ = 8;
                      auVar58._28_4_ = 8;
                      auVar40._8_4_ = 0x10;
                      auVar40._0_8_ = 0x1000000010;
                      auVar40._12_4_ = 0x10;
                      auVar40._16_4_ = 0x10;
                      auVar40._20_4_ = 0x10;
                      auVar40._24_4_ = 0x10;
                      auVar40._28_4_ = 0x10;
                      auVar44 = vblendvps_avx(auVar40,auVar58,auVar44);
                      *(undefined1 (*) [32])
                       ((long)((ppVar17->field_4).rowcols)->score_row + lVar28 + local_170) =
                           auVar44;
                    }
                    auVar44 = vpsubd_avx2(auVar12,auVar51);
                    in_ZMM13 = ZEXT3264(auVar44);
                    if (uVar34 < uVar38) {
                      piVar8 = ((ppVar17->field_4).rowcols)->score_row;
                      auVar56 = vpcmpgtd_avx2(auVar42,auVar44);
                      auVar59._8_4_ = 0x20;
                      auVar59._0_8_ = 0x2000000020;
                      auVar59._12_4_ = 0x20;
                      auVar59._16_4_ = 0x20;
                      auVar59._20_4_ = 0x20;
                      auVar59._24_4_ = 0x20;
                      auVar59._28_4_ = 0x20;
                      auVar52._8_4_ = 0x40;
                      auVar52._0_8_ = 0x4000000040;
                      auVar52._12_4_ = 0x40;
                      auVar52._16_4_ = 0x40;
                      auVar52._20_4_ = 0x40;
                      auVar52._24_4_ = 0x40;
                      auVar52._28_4_ = 0x40;
                      auVar56 = vblendvps_avx(auVar52,auVar59,auVar56);
                      auVar56 = vorps_avx(auVar56,*(undefined1 (*) [32])
                                                   ((long)piVar8 + lVar28 + 0x20 + lVar33));
                      *(undefined1 (*) [32])((long)piVar8 + lVar28 + 0x20 + lVar33) = auVar56;
                    }
                    auVar56 = vpmaxsd_avx2(auVar47._0_32_,auVar11);
                    auVar47 = ZEXT3264(auVar56);
                    auVar2 = vpminsd_avx2(auVar49._0_32_,auVar2);
                    auVar12 = vpminsd_avx2(auVar2,auVar12);
                    auVar12 = vpminsd_avx2(auVar12,auVar11);
                    auVar49 = ZEXT3264(auVar12);
                    auVar12 = vpmaxsd_avx2(auVar42,auVar44);
                    auVar44 = *(undefined1 (*) [32])((long)*ptr_04 + lVar28);
                    uVar34 = uVar34 + 1;
                  }
                  auVar44 = in_ZMM13._0_32_;
                  auVar2 = auVar12;
                  for (iVar23 = 0; iVar23 != 8; iVar23 = iVar23 + 1) {
                    uVar31 = uVar29;
                    if (s2_beg == 0) {
                      uVar31 = ptr_03[uVar20 + 1] - open;
                    }
                    auVar42 = vpermd_avx2(auVar13,(undefined1  [32])ptr_04[uVar30 - 1]);
                    auVar42 = vpblendd_avx2(auVar42,ZEXT432((uint)ptr_03[uVar20]),1);
                    auVar56 = vpermd_avx2(auVar13,in_ZMM11._0_32_);
                    auVar56 = vpblendd_avx2(auVar56,ZEXT432(uVar31),1);
                    in_ZMM11 = ZEXT3264(auVar56);
                    auVar56 = vpermd_avx2(auVar13,in_ZMM13._0_32_);
                    auVar56 = vpblendd_avx2(auVar56,ZEXT432(uVar22),1);
                    auVar2 = vpermd_avx2(auVar13,auVar2);
                    auVar2 = vpblendd_avx2(auVar2,ZEXT432(uVar31),1);
                    auVar44 = vpermd_avx2(auVar13,auVar44);
                    auVar44 = vpblendd_avx2(auVar44,ZEXT432(uVar22),1);
                    auVar12 = vpermd_avx2(auVar13,auVar12);
                    auVar12 = vpblendd_avx2(auVar12,ZEXT432(uVar31),1);
                    lVar37 = 0;
                    uVar34 = uVar38;
                    lVar28 = lVar33;
                    while( true ) {
                      in_ZMM13 = ZEXT3264(auVar56);
                      bVar39 = uVar34 == 0;
                      uVar34 = uVar34 - 1;
                      if (bVar39) break;
                      auVar56 = *(undefined1 (*) [32])((long)*ptr + lVar37);
                      auVar11 = vpmaxsd_avx2(auVar56,auVar2);
                      *(undefined1 (*) [32])((long)*ptr + lVar37) = auVar11;
                      auVar42 = vpaddd_avx2(auVar42,*(undefined1 (*) [32])
                                                     ((long)pvVar6 + lVar37 + (long)iVar16 * 0x20));
                      auVar42 = vpcmpeqd_avx2(auVar11,auVar42);
                      auVar56 = vpcmpgtd_avx2(auVar56,auVar2);
                      auVar42 = vpor_avx2(auVar42,auVar56);
                      auVar41._8_4_ = 2;
                      auVar41._0_8_ = 0x200000002;
                      auVar41._12_4_ = 2;
                      auVar41._16_4_ = 2;
                      auVar41._20_4_ = 2;
                      auVar41._24_4_ = 2;
                      auVar41._28_4_ = 2;
                      auVar56 = vblendvps_avx(auVar41,*(undefined1 (*) [32])((long)*ptr_02 + lVar37)
                                              ,auVar42);
                      auVar42._8_8_ = 0x7800000078;
                      auVar42._0_8_ = 0x7800000078;
                      auVar42._16_8_ = 0x7800000078;
                      auVar42._24_8_ = 0x7800000078;
                      auVar42 = vandps_avx(auVar42,*(undefined1 (*) [32])
                                                    ((long)((ppVar17->field_4).rowcols)->score_row +
                                                    lVar28));
                      *(undefined1 (*) [32])((long)*ptr_02 + lVar37) = auVar56;
                      auVar42 = vorps_avx(auVar42,auVar56);
                      *(undefined1 (*) [32])((long)((ppVar17->field_4).rowcols)->score_row + lVar28)
                           = auVar42;
                      auVar44 = vpcmpgtd_avx2(in_ZMM11._0_32_,auVar44);
                      auVar43._8_4_ = 0x20;
                      auVar43._0_8_ = 0x2000000020;
                      auVar43._12_4_ = 0x20;
                      auVar43._16_4_ = 0x20;
                      auVar43._20_4_ = 0x20;
                      auVar43._24_4_ = 0x20;
                      auVar43._28_4_ = 0x20;
                      auVar53._8_4_ = 0x40;
                      auVar53._0_8_ = 0x4000000040;
                      auVar53._12_4_ = 0x40;
                      auVar53._16_4_ = 0x40;
                      auVar53._20_4_ = 0x40;
                      auVar53._24_4_ = 0x40;
                      auVar53._28_4_ = 0x40;
                      auVar42 = vblendvps_avx(auVar53,auVar43,auVar44);
                      piVar8 = ((ppVar17->field_4).rowcols)->score_row;
                      auVar44._8_8_ = 0x1f0000001f;
                      auVar44._0_8_ = 0x1f0000001f;
                      auVar44._16_8_ = 0x1f0000001f;
                      auVar44._24_8_ = 0x1f0000001f;
                      auVar44 = vandps_avx(auVar44,*(undefined1 (*) [32])((long)piVar8 + lVar28));
                      auVar44 = vorps_avx(auVar44,auVar42);
                      *(undefined1 (*) [32])((long)piVar8 + lVar28) = auVar44;
                      auVar42 = vpsubd_avx2(auVar11,auVar50);
                      in_ZMM11 = ZEXT3264(auVar42);
                      auVar56 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar37),auVar51);
                      auVar44 = vpmaxsd_avx2(auVar42,auVar56);
                      *(undefined1 (*) [32])((long)*palVar24 + lVar37) = auVar44;
                      if (iVar26 < s2Len) {
                        auVar44 = vpcmpgtd_avx2(auVar42,auVar56);
                        auVar45._8_4_ = 8;
                        auVar45._0_8_ = 0x800000008;
                        auVar45._12_4_ = 8;
                        auVar45._16_4_ = 8;
                        auVar45._20_4_ = 8;
                        auVar45._24_4_ = 8;
                        auVar45._28_4_ = 8;
                        auVar54._8_4_ = 0x10;
                        auVar54._0_8_ = 0x1000000010;
                        auVar54._12_4_ = 0x10;
                        auVar54._16_4_ = 0x10;
                        auVar54._20_4_ = 0x10;
                        auVar54._24_4_ = 0x10;
                        auVar54._28_4_ = 0x10;
                        auVar44 = vblendvps_avx(auVar54,auVar45,auVar44);
                        *(undefined1 (*) [32])
                         ((long)((ppVar17->field_4).rowcols)->score_row + lVar28 + lVar36) = auVar44
                        ;
                      }
                      auVar44 = vpminsd_avx2(auVar49._0_32_,auVar11);
                      auVar49 = ZEXT3264(auVar44);
                      auVar44 = vpmaxsd_avx2(auVar47._0_32_,auVar11);
                      auVar47 = ZEXT3264(auVar44);
                      auVar56 = vpsubd_avx2(auVar2,auVar51);
                      auVar44 = vpcmpgtd_avx2(auVar42,auVar56);
                      auVar44 = auVar10 & ~auVar44;
                      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar44 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar44 >> 0x7f,0) == '\0') &&
                            (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar44 >> 0xbf,0) == '\0') &&
                          (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar44[0x1f]) {
                        in_ZMM13 = ZEXT3264(auVar56);
                        goto LAB_00814932;
                      }
                      auVar44 = vpsubd_avx2(auVar12,auVar51);
                      auVar12 = vpmaxsd_avx2(auVar42,auVar44);
                      auVar42 = *(undefined1 (*) [32])((long)*ptr_04 + lVar37);
                      lVar28 = lVar28 + 0x20;
                      lVar37 = lVar37 + 0x20;
                      auVar2 = auVar56;
                    }
                  }
LAB_00814932:
                  auVar44 = vpcmpgtd_avx2((undefined1  [32])ptr[uVar9],auVar55);
                  auVar55 = vpmaxsd_avx2((undefined1  [32])ptr[uVar9],auVar55);
                  auVar44 = auVar46 & auVar44;
                  local_180 = (int)uVar20;
                  if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar44 >> 0x7f,0) != '\0') ||
                        (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar44 >> 0xbf,0) != '\0') ||
                      (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar44[0x1f] < '\0') {
                    local_1ac = local_180;
                  }
                  local_170 = local_170 + lVar36;
                  lVar33 = lVar33 + lVar36;
                  palVar19 = ptr_01;
                  uVar20 = uVar20 + 1;
                  palVar18 = ptr;
                  ptr_01 = palVar24;
                  ptr = ptr_04;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_trace_striped_profile_avx2_256_32",pcVar25);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEaStore = NULL;
    __m256i* restrict pvEaLoad = NULL;
    __m256i* restrict pvHT = NULL;
    int32_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;
    __m256i vTMask;
    __m256i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi32(_mm256_set1_epi32(position),
            _mm256_set_epi32(0,1,2,3,4,5,6,7));
    vTIns  = _mm256_set1_epi32(PARASAIL_INS);
    vTDel  = _mm256_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm256_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm256_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    pvEaStore= parasail_memalign___m256i(32, segLen);
    pvEaLoad = parasail_memalign___m256i(32, segLen);
    pvHT     = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            _mm256_store_si256(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFa;
        __m256i vFa_ext;
        __m256i vH;
        __m256i vH_dag;
        const __m256i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi32_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vF);

            {
                __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m256i case1 = _mm256_cmpeq_epi32(vH, vH_dag);
                __m256i case2 = _mm256_cmpeq_epi32(vH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm256_store_si256(pvHT + i, vT);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            _mm256_store_si256(pvE + i, vE);
            {
                __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                _mm256_store_si256(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m256i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
            vEF_opn = _mm256_slli_si256_rpl(vEF_opn, 4);
            vEF_opn = _mm256_insert_epi32_rpl(vEF_opn, tmp2, 0);
            vF_ext = _mm256_slli_si256_rpl(vF_ext, 4);
            vF_ext = _mm256_insert_epi32_rpl(vF_ext, NEG_LIMIT, 0);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, tmp2, 0);
            vFa_ext = _mm256_slli_si256_rpl(vFa_ext, 4);
            vFa_ext = _mm256_insert_epi32_rpl(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm256_slli_si256_rpl(vFa, 4);
            vFa = _mm256_insert_epi32_rpl(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
                {
                    __m256i vTAll;
                    __m256i vT;
                    __m256i case1;
                    __m256i case2;
                    __m256i cond;
                    vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                    case1 = _mm256_cmpeq_epi32(vH, vHp);
                    case2 = _mm256_cmpeq_epi32(vH, vF);
                    cond = _mm256_andnot_si256(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm256_load_si256(pvHT + i);
                    vT = _mm256_blendv_epi8(vT, vTDel, cond);
                    _mm256_store_si256(pvHT + i, vT);
                    vTAll = _mm256_and_si256(vTAll, vTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm256_and_si256(vTAll, vFTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                {
                    __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                    __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                    vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                    _mm256_store_si256(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm256_sub_epi32(vFa, vGapE);
                vFa = _mm256_max_epi32(vEF_opn, vFa_ext);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    }

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}